

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void gola_resolve(LexState *ls,FuncScope *bl,MSize idx)

{
  uint uVar1;
  uint in_EDX;
  long in_RSI;
  LexState *in_RDI;
  GCstr *name;
  VarInfo *vl;
  VarInfo *vg;
  VarInfo *in_stack_ffffffffffffffd0;
  LexState *vg_00;
  LexState *ls_00;
  
  ls_00 = (LexState *)(in_RDI->vstack + *(uint *)(in_RSI + 8));
  vg_00 = (LexState *)(in_RDI->vstack + in_EDX);
  do {
    if (vg_00 <= ls_00) {
      return;
    }
    if ((*(uint32_t *)&ls_00->fs == ((GCRef *)&vg_00->fs)->gcptr32) &&
       (((ulong)ls_00->L & 0x20000000000) != 0)) {
      if (*(byte *)((long)&ls_00->L + 4) < *(uint8_t *)((long)&vg_00->L + 4)) {
        uVar1 = in_RDI->vstack[in_RDI->fs->varmap[*(byte *)((long)&ls_00->L + 4)]].name.gcptr32;
        in_RDI->linenumber = in_RDI->fs->bcbase[*(uint *)((long)&ls_00->fs + 4)].line;
        lj_lex_error(in_RDI,0,LJ_ERR_XGSCOPE,(ulong)*(uint *)&ls_00->fs + 0x10,(ulong)uVar1 + 0x10);
      }
      gola_patch(ls_00,(VarInfo *)vg_00,in_stack_ffffffffffffffd0);
    }
    ls_00 = (LexState *)&ls_00->tokenval;
  } while( true );
}

Assistant:

static void gola_resolve(LexState *ls, FuncScope *bl, MSize idx)
{
  VarInfo *vg = ls->vstack + bl->vstart;
  VarInfo *vl = ls->vstack + idx;
  for (; vg < vl; vg++)
    if (gcrefeq(vg->name, vl->name) && gola_isgoto(vg)) {
      if (vg->slot < vl->slot) {
	GCstr *name = strref(var_get(ls, ls->fs, vg->slot).name);
	lua_assert((uintptr_t)name >= VARNAME__MAX);
	ls->linenumber = ls->fs->bcbase[vg->startpc].line;
	lua_assert(strref(vg->name) != NAME_BREAK);
	lj_lex_error(ls, 0, LJ_ERR_XGSCOPE,
		     strdata(strref(vg->name)), strdata(name));
      }
      gola_patch(ls, vg, vl);
    }
}